

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::vector
          (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
           *this,size_t count,Point2<float> *value,
          polymorphic_allocator<pbrt::Point2<float>_> *alloc)

{
  undefined8 *in_RCX;
  Point2<float> *in_RDX;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *in_RSI;
  polymorphic_allocator<pbrt::Point2<float>> *in_RDI;
  size_t i;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *local_28;
  
  *(undefined8 *)in_RDI = *in_RCX;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
                   *)0x0; local_28 < in_RSI;
      local_28 = (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
                  *)((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<pbrt::Point2<float>>::
    construct<pbrt::Point2<float>,pbrt::Point2<float>const&>
              (in_RDI,(Point2<float> *)(*(long *)(in_RDI + 8) + (long)local_28 * 8),in_RDX);
  }
  *(vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> **)
   (in_RDI + 0x18) = in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }